

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
          *handler)

{
  null_terminating_iterator<char> other;
  null_terminating_iterator<char> it_00;
  null_terminating_iterator<char> nVar1;
  char cVar2;
  bool bVar3;
  char *s;
  difference_type value;
  type count;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
  *this_00;
  bool local_8a;
  basic_string_view<char> local_68;
  null_terminating_iterator<char> local_58;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
  *local_48;
  null_terminating_iterator<char> start;
  uint index;
  char_type c;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
  *handler_local;
  null_terminating_iterator<char> it_local;
  char *local_10;
  
  this_00 = (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
             *)it.end_;
  it_local.ptr_ = it.ptr_;
  handler_local =
       (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
        *)this;
  start.end_._7_1_ =
       null_terminating_iterator<char>::operator*((null_terminating_iterator<char> *)&handler_local)
  ;
  if ((start.end_._7_1_ == '}') || (start.end_._7_1_ == ':')) {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
    ::operator()(this_00);
    it_local.end_ = (char *)handler_local;
    local_10 = it_local.ptr_;
  }
  else if ((start.end_._7_1_ < '0') || ('9' < start.end_._7_1_)) {
    bVar3 = is_name_start<char>(start.end_._7_1_);
    if (bVar3) {
      local_48 = handler_local;
      start.ptr_ = it_local.ptr_;
      do {
        local_58 = null_terminating_iterator<char>::operator++
                             ((null_terminating_iterator<char> *)&handler_local);
        start.end_._7_1_ = null_terminating_iterator<char>::operator*(&local_58);
        bVar3 = is_name_start<char>(start.end_._7_1_);
        local_8a = true;
        if (!bVar3) {
          local_8a = '/' < start.end_._7_1_ && start.end_._7_1_ < ':';
        }
      } while (local_8a);
      it_00.end_ = start.ptr_;
      it_00.ptr_ = (char *)local_48;
      s = pointer_from<char>(it_00);
      other.end_ = start.ptr_;
      other.ptr_ = (char *)local_48;
      value = null_terminating_iterator<char>::operator-
                        ((null_terminating_iterator<char> *)&handler_local,other);
      count = to_unsigned<long>(value);
      basic_string_view<char>::basic_string_view(&local_68,s,count);
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
      ::operator()(this_00,local_68);
      it_local.end_ = (char *)handler_local;
      local_10 = it_local.ptr_;
    }
    else {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
      ::on_error(this_00,"invalid format string");
      it_local.end_ = (char *)handler_local;
      local_10 = it_local.ptr_;
    }
  }
  else {
    start.end_._0_4_ =
         parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>&>
                   ((null_terminating_iterator<char> *)&handler_local,this_00);
    cVar2 = null_terminating_iterator<char>::operator*
                      ((null_terminating_iterator<char> *)&handler_local);
    if ((cVar2 == '}') ||
       (cVar2 = null_terminating_iterator<char>::operator*
                          ((null_terminating_iterator<char> *)&handler_local), cVar2 == ':')) {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
      ::operator()(this_00,(uint)start.end_);
      it_local.end_ = (char *)handler_local;
      local_10 = it_local.ptr_;
    }
    else {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
      ::on_error(this_00,"invalid format string");
      it_local.end_ = (char *)handler_local;
      local_10 = it_local.ptr_;
    }
  }
  nVar1.end_ = local_10;
  nVar1.ptr_ = it_local.end_;
  return nVar1;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}